

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystem::initializeSDLOrQuitAndThrowError(SDLGraphicsSystem *this)

{
  int iVar1;
  pointer pWVar2;
  allocator<char> local_31;
  string local_30;
  SDLGraphicsSystem *local_10;
  SDLGraphicsSystem *this_local;
  
  local_10 = this;
  pWVar2 = std::
           unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ::operator->(&this->sdl);
  iVar1 = (*pWVar2->_vptr_Wrapper[2])(pWVar2,0x20);
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Cannot initialize graphics system",&local_31);
    quitAndThrow(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  this->isSDLInitialized = true;
  return;
}

Assistant:

void SDLGraphicsSystem::initializeSDLOrQuitAndThrowError() {
    if (sdl->init(SDL_INIT_VIDEO))
        quitAndThrow("Cannot initialize graphics system");

    isSDLInitialized = true;
}